

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resampler.c
# Opt level: O2

void resampler_fill_and_remove_delay(resampler *r)

{
  float *__src;
  float *__dest;
  size_t sVar1;
  float *pfVar2;
  float *pfVar3;
  byte bVar4;
  anon_struct_8_2_f9ee98fb_for_bigint_1 aVar5;
  uint uVar6;
  uint uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  float *in_;
  float *pfVar14;
  float *pfVar15;
  int iVar16;
  ulong uVar17;
  uint uVar18;
  int iVar19;
  uint uVar20;
  int iVar21;
  bigint inv_phase;
  ulong uVar22;
  uint uVar23;
  unsigned_long_long uVar24;
  ulong uVar25;
  ulong uVar26;
  unsigned_long_long uVar27;
  ulong uVar28;
  int iVar29;
  float *out;
  float *pfVar30;
  float *pfVar31;
  long lVar32;
  bool bVar33;
  float fVar34;
  double dVar35;
  double dVar36;
  float fVar37;
  double dVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  double dVar42;
  undefined8 uStack_138;
  float local_130 [64];
  
  iVar11 = resampler_min_filled(r);
  iVar21 = resampler_has_sse;
  bVar4 = r->quality;
  __src = r->buffer_out;
  __dest = r->buffer_out + 0x40;
  uVar13 = r->write_filled;
  do {
    if (((int)uVar13 <= iVar11) || (iVar29 = r->read_filled, 0x3f < iVar29)) goto LAB_0064cf18;
    iVar19 = r->read_pos;
    iVar16 = (iVar19 + iVar29) % 0x40;
    pfVar30 = __src + iVar16;
    iVar12 = iVar16;
    if (iVar16 < iVar29) {
      iVar12 = iVar29;
    }
    if (5 < bVar4) goto LAB_0064cefd;
    lVar32 = (long)(int)uVar13;
    uVar25 = (ulong)(0x40 - iVar12);
    uVar17 = (ulong)uVar13;
    switch(bVar4) {
    case 0:
      pfVar31 = pfVar30 + uVar25;
      pfVar15 = (float *)((long)r + lVar32 * -4 + (long)r->write_pos * 4 + 0x148);
      uVar25 = (r->phase).quad;
      uVar24 = (r->phase_inc).quad;
      pfVar14 = pfVar15;
      do {
        if (pfVar31 <= pfVar30) break;
        *pfVar30 = *pfVar14;
        pfVar30 = pfVar30 + 1;
        uVar25 = uVar25 + uVar24;
        pfVar14 = pfVar14 + (uVar25 >> 0x20);
        uVar25 = uVar25 & 0xffffffff;
      } while (pfVar14 < pfVar15 + (uVar17 - 1));
      (r->phase).quad = uVar25;
      uVar13 = uVar13 - (int)((ulong)((long)pfVar14 - (long)pfVar15) >> 2);
LAB_0064cef9:
      r->write_filled = uVar13;
      break;
    case 1:
      iVar29 = 0x1f;
      if (iVar19 < 0x1f) {
        iVar29 = iVar19;
      }
      if (iVar16 < iVar19) {
        iVar29 = 0;
      }
      sVar1 = (long)iVar29 * 4;
      memcpy(__dest,__src,sVar1);
      pfVar15 = (float *)((long)r + lVar32 * -4 + (long)r->write_pos * 4 + 0x148);
      pfVar31 = pfVar30 + uVar25 + (long)iVar29;
      dVar36 = r->last_amp;
      uVar25 = (r->inv_phase).quad;
      uVar24 = (r->inv_phase_inc).quad;
      pfVar14 = pfVar15;
      if (iVar21 == 0) {
        do {
          if (pfVar31 < pfVar30 + 0x20) break;
          fVar34 = *pfVar14;
          dVar38 = (double)fVar34 - dVar36;
          if (dVar38 != 0.0) {
            iVar29 = (int)(uVar25 >> 0x16);
            uVar18 = iVar29 - 0x4000;
            uVar20 = (iVar29 * 0x399) / 0x400 - 0x3990;
            dVar42 = 0.0;
            for (uVar23 = 0x1f; -0x10 < (int)(uVar23 - 0xf); uVar23 = uVar23 - 1) {
              uVar6 = -uVar20;
              if (0 < (int)uVar20) {
                uVar6 = uVar20;
              }
              uVar7 = -uVar18;
              if (0 < (int)uVar18) {
                uVar7 = uVar18;
              }
              fVar37 = window_lut[uVar7];
              fVar39 = sinc_lut[uVar6];
              (&uStack_138)[uVar23] = (double)(fVar37 * fVar39);
              dVar42 = dVar42 + (double)(fVar37 * fVar39);
              uVar18 = uVar18 + 0x400;
              uVar20 = uVar20 + 0x399;
            }
            for (lVar32 = 0; dVar36 = (double)fVar34, lVar32 != 0x20; lVar32 = lVar32 + 1) {
              pfVar30[lVar32] =
                   (float)((double)(&uStack_138)[lVar32] * dVar38 * (1.0 / dVar42)) +
                   pfVar30[lVar32];
            }
          }
          pfVar14 = pfVar14 + 1;
          uVar25 = uVar25 + uVar24;
          pfVar30 = pfVar30 + (uVar25 >> 0x20);
          uVar25 = uVar25 & 0xffffffff;
        } while (pfVar14 < pfVar15 + (uVar17 - 1));
        (r->inv_phase).quad = uVar25;
        r->last_amp = dVar36;
        iVar29 = (int)((ulong)((long)pfVar14 - (long)pfVar15) >> 2);
        uVar13 = uVar13 - iVar29;
      }
      else {
        do {
          if (pfVar31 < pfVar30 + 0x20) break;
          fVar34 = *pfVar14;
          dVar38 = (double)fVar34 - dVar36;
          if (dVar38 != 0.0) {
            iVar29 = (int)(uVar25 >> 0x16);
            uVar13 = (iVar29 * 0x399) / 0x400 - 0x3990;
            uVar23 = iVar29 - 0x4000;
            fVar37 = 0.0;
            for (lVar32 = 0x10; -0x10 < lVar32; lVar32 = lVar32 + -1) {
              uVar20 = -uVar13;
              if (0 < (int)uVar13) {
                uVar20 = uVar13;
              }
              uVar18 = -uVar23;
              if (0 < (int)uVar23) {
                uVar18 = uVar23;
              }
              fVar39 = window_lut[uVar18];
              fVar40 = sinc_lut[uVar20];
              local_130[lVar32 + 0xd] = fVar39 * fVar40;
              fVar37 = fVar37 + fVar39 * fVar40;
              uVar13 = uVar13 + 0x399;
              uVar23 = uVar23 + 0x400;
            }
            fVar37 = (float)(dVar38 / (double)fVar37);
            for (lVar32 = 0; dVar36 = (double)fVar34, lVar32 != 0x80; lVar32 = lVar32 + 0x10) {
              fVar39 = *(float *)((long)&uStack_138 + lVar32 + 4);
              fVar40 = *(float *)((long)local_130 + lVar32);
              fVar41 = *(float *)((long)local_130 + lVar32 + 4);
              pfVar2 = (float *)((long)pfVar30 + lVar32);
              fVar8 = pfVar2[1];
              fVar9 = pfVar2[2];
              fVar10 = pfVar2[3];
              pfVar3 = (float *)((long)pfVar30 + lVar32);
              *pfVar3 = *pfVar2 + *(float *)((long)&uStack_138 + lVar32) * fVar37;
              pfVar3[1] = fVar8 + fVar39 * fVar37;
              pfVar3[2] = fVar9 + fVar40 * fVar37;
              pfVar3[3] = fVar10 + fVar41 * fVar37;
            }
          }
          pfVar14 = pfVar14 + 1;
          uVar25 = uVar25 + uVar24;
          pfVar30 = pfVar30 + (uVar25 >> 0x20);
          uVar25 = uVar25 & 0xffffffff;
        } while (pfVar14 < pfVar15 + (uVar17 - 1));
        (r->inv_phase).quad = uVar25;
        r->last_amp = dVar36;
        iVar29 = (int)((ulong)((long)pfVar14 - (long)pfVar15) >> 2);
        uVar13 = r->write_filled - iVar29;
      }
      r->write_filled = uVar13;
      memcpy(__src,__dest,sVar1);
      bVar33 = iVar29 == 0;
      goto LAB_0064cc1c;
    case 2:
      if (2 < (int)uVar13) {
        pfVar31 = pfVar30 + uVar25;
        pfVar15 = (float *)((long)r + lVar32 * -4 + (long)r->write_pos * 4 + 0x148);
        uVar23 = (r->phase).field_1.lo;
        uVar20 = (r->phase).field_1.hi;
        aVar5 = (r->phase_inc).field_1;
        pfVar14 = pfVar15;
        do {
          if (pfVar31 <= pfVar30) goto LAB_0064c42e;
          *pfVar30 = (float)uVar23 * 2.3283064e-10 * (pfVar14[1] - *pfVar14) + *pfVar14;
          pfVar30 = pfVar30 + 1;
          lVar32 = (ulong)uVar23 + (long)aVar5;
          pfVar14 = pfVar14 + (uVar20 + (int)((ulong)lVar32 >> 0x20));
          uVar23 = uVar23 + aVar5.lo;
          uVar20 = 0;
        } while (pfVar14 < pfVar15 + (uVar17 - 2));
        uVar23 = (uint)lVar32;
LAB_0064c42e:
        (r->phase).field_1.lo = uVar23;
        (r->phase).field_1.hi = uVar20;
        uVar13 = uVar13 - (int)((ulong)((long)pfVar14 - (long)pfVar15) >> 2);
        goto LAB_0064cef9;
      }
      break;
    case 3:
      iVar29 = 0x1f;
      if (iVar19 < 0x1f) {
        iVar29 = iVar19;
      }
      if (iVar16 < iVar19) {
        iVar29 = 0;
      }
      sVar1 = (long)iVar29 * 4;
      memcpy(__dest,__src,sVar1);
      pfVar14 = (float *)((long)r + lVar32 * -4 + (long)r->write_pos * 4 + 0x148);
      pfVar31 = pfVar30;
      if (iVar21 == 0) {
        if ((int)uVar13 < 3) {
LAB_0064cf18:
          if (r->delay_removed < '\0') {
            r->delay_removed = '\0';
            iVar21 = 0xf;
            if ((r->quality - 1 & 0xfd) != 0) {
              iVar21 = 0;
            }
            while (bVar33 = iVar21 != 0, iVar21 = iVar21 + -1, bVar33) {
              resampler_remove_sample(r,1);
            }
          }
          return;
        }
        dVar36 = r->last_amp;
        uVar24 = (r->phase).quad;
        uVar28 = (r->phase_inc).quad;
        uVar27 = (r->inv_phase).quad;
        uVar22 = (r->inv_phase_inc).quad;
        pfVar15 = pfVar14;
        do {
          if (pfVar30 + uVar25 + (long)iVar29 < pfVar31 + 0x20) break;
          dVar38 = (double)*pfVar15;
          if (uVar28 >> 0x20 == 0) {
            dVar38 = dVar38 + (double)((float)uVar24 * 2.3283064e-10 * (pfVar15[1] - *pfVar15));
          }
          dVar42 = dVar38 - dVar36;
          if (dVar42 != 0.0) {
            iVar19 = (int)(uVar27 >> 0x16);
            uVar18 = iVar19 - 0x4000;
            uVar20 = (iVar19 * 0x3b8) / 0x400 - 0x3b80;
            dVar35 = 0.0;
            for (uVar23 = 0x1f; -0x10 < (int)(uVar23 - 0xf); uVar23 = uVar23 - 1) {
              uVar6 = -uVar20;
              if (0 < (int)uVar20) {
                uVar6 = uVar20;
              }
              uVar7 = -uVar18;
              if (0 < (int)uVar18) {
                uVar7 = uVar18;
              }
              fVar34 = window_lut[uVar7];
              fVar37 = sinc_lut[uVar6];
              (&uStack_138)[uVar23] = (double)(fVar34 * fVar37);
              dVar35 = dVar35 + (double)(fVar34 * fVar37);
              uVar18 = uVar18 + 0x400;
              uVar20 = uVar20 + 0x3b8;
            }
            for (lVar32 = 0; dVar36 = dVar38, lVar32 != 0x20; lVar32 = lVar32 + 1) {
              pfVar31[lVar32] =
                   (float)((double)(&uStack_138)[lVar32] * dVar42 * (1.0 / dVar35)) +
                   pfVar31[lVar32];
            }
          }
          if (uVar22 >> 0x20 == 0) {
            pfVar15 = pfVar15 + 1;
            uVar26 = uVar27 + uVar22;
            pfVar31 = pfVar31 + (uVar26 >> 0x20);
            uVar27 = uVar26 & 0xffffffff;
          }
          else {
            uVar26 = uVar24 + uVar28;
            pfVar31 = pfVar31 + 1;
            pfVar15 = pfVar15 + (uVar26 >> 0x20);
            uVar24 = uVar26 & 0xffffffff;
          }
        } while (pfVar15 < pfVar14 + (uVar17 - 2));
        (r->phase).quad = uVar24;
        (r->inv_phase).quad = uVar27;
        r->last_amp = dVar36;
        iVar29 = (int)((ulong)((long)pfVar15 - (long)pfVar14) >> 2);
      }
      else {
        if ((int)uVar13 < 3) goto LAB_0064cf18;
        dVar36 = r->last_amp;
        uVar24 = (r->phase).quad;
        uVar28 = (r->phase_inc).quad;
        uVar22 = (r->inv_phase).quad;
        uVar26 = (r->inv_phase_inc).quad;
        pfVar15 = pfVar14;
        do {
          if (pfVar30 + uVar25 + (long)iVar29 < pfVar31 + 0x20) break;
          dVar38 = (double)*pfVar15;
          if (uVar28 >> 0x20 == 0) {
            dVar38 = dVar38 + (double)((float)uVar24 * 2.3283064e-10 * (pfVar15[1] - *pfVar15));
          }
          if (dVar38 - dVar36 != 0.0) {
            iVar19 = (int)(uVar22 >> 0x16);
            uVar13 = (iVar19 * 0x3b8) / 0x400 - 0x3b80;
            uVar23 = iVar19 - 0x4000;
            fVar34 = 0.0;
            for (lVar32 = 0x10; -0x10 < lVar32; lVar32 = lVar32 + -1) {
              uVar20 = -uVar13;
              if (0 < (int)uVar13) {
                uVar20 = uVar13;
              }
              uVar18 = -uVar23;
              if (0 < (int)uVar23) {
                uVar18 = uVar23;
              }
              fVar37 = window_lut[uVar18];
              fVar39 = sinc_lut[uVar20];
              local_130[lVar32 + 0xd] = fVar37 * fVar39;
              fVar34 = fVar34 + fVar37 * fVar39;
              uVar13 = uVar13 + 0x3b8;
              uVar23 = uVar23 + 0x400;
            }
            fVar34 = (float)((dVar38 - dVar36) / (double)fVar34);
            for (lVar32 = 0; dVar36 = dVar38, lVar32 != 0x80; lVar32 = lVar32 + 0x10) {
              fVar37 = *(float *)((long)&uStack_138 + lVar32 + 4);
              fVar39 = *(float *)((long)local_130 + lVar32);
              fVar40 = *(float *)((long)local_130 + lVar32 + 4);
              pfVar2 = (float *)((long)pfVar31 + lVar32);
              fVar41 = pfVar2[1];
              fVar8 = pfVar2[2];
              fVar9 = pfVar2[3];
              pfVar3 = (float *)((long)pfVar31 + lVar32);
              *pfVar3 = *pfVar2 + *(float *)((long)&uStack_138 + lVar32) * fVar34;
              pfVar3[1] = fVar41 + fVar37 * fVar34;
              pfVar3[2] = fVar8 + fVar39 * fVar34;
              pfVar3[3] = fVar9 + fVar40 * fVar34;
            }
          }
          if (uVar26 >> 0x20 == 0) {
            pfVar15 = pfVar15 + 1;
            uVar22 = uVar22 + uVar26;
            pfVar31 = pfVar31 + (uVar22 >> 0x20);
            uVar22 = uVar22 & 0xffffffff;
          }
          else {
            uVar24 = uVar24 + uVar28;
            pfVar31 = pfVar31 + 1;
            if (uVar24 >> 0x20 != 0) {
              pfVar15 = pfVar15 + 1;
              uVar24 = uVar24 & 0xffffffff;
            }
          }
        } while (pfVar15 < pfVar14 + (uVar17 - 2));
        (r->phase).quad = uVar24;
        (r->inv_phase).quad = uVar22;
        r->last_amp = dVar36;
        iVar29 = (int)((ulong)((long)pfVar15 - (long)pfVar14) >> 2);
        uVar13 = r->write_filled;
      }
      uVar13 = uVar13 - iVar29;
      r->write_filled = uVar13;
      memcpy(__src,__dest,sVar1);
      bVar33 = pfVar31 == pfVar30;
      pfVar30 = pfVar31;
LAB_0064cc1c:
      if (bVar33) goto LAB_0064cf18;
      break;
    case 4:
      pfVar14 = (float *)((long)r + lVar32 * -4 + (long)r->write_pos * 4 + 0x148);
      pfVar31 = pfVar30 + uVar25;
      if (iVar21 == 0) {
        if (4 < (int)uVar13) {
          uVar24 = (r->phase).quad;
          uVar27 = (r->phase_inc).quad;
          pfVar15 = pfVar14;
          do {
            if (pfVar31 <= pfVar30) break;
            fVar34 = 0.0;
            for (lVar32 = 0; lVar32 != 4; lVar32 = lVar32 + 1) {
              fVar34 = fVar34 + cubic_lut[((long)(int)(uVar24 >> 0x14) & 0xfffffffffffffffcU) +
                                          lVar32] * pfVar15[lVar32];
            }
            *pfVar30 = fVar34;
            pfVar30 = pfVar30 + 1;
            uVar25 = uVar24 + uVar27;
            pfVar15 = pfVar15 + (uVar25 >> 0x20);
            uVar24 = uVar25 & 0xffffffff;
          } while (pfVar15 < pfVar14 + (uVar17 - 4));
          (r->phase).quad = uVar24;
          uVar13 = uVar13 - (int)((ulong)((long)pfVar15 - (long)pfVar14) >> 2);
          goto LAB_0064cef9;
        }
      }
      else if (4 < (int)uVar13) {
        uVar24 = (r->phase).quad;
        uVar27 = (r->phase_inc).quad;
        pfVar15 = pfVar14;
        do {
          if (pfVar31 <= pfVar30) break;
          uVar25 = (long)(int)(uVar24 >> 0x14) & 0xfffffffffffffffc;
          *pfVar30 = pfVar15[3] * cubic_lut[uVar25 + 3] + pfVar15[1] * cubic_lut[uVar25 + 1] +
                     pfVar15[2] * cubic_lut[uVar25 + 2] + *pfVar15 * cubic_lut[uVar25];
          pfVar30 = pfVar30 + 1;
          uVar25 = uVar24 + uVar27;
          pfVar15 = pfVar15 + (uVar25 >> 0x20);
          uVar24 = uVar25 & 0xffffffff;
        } while (pfVar15 < pfVar14 + (uVar17 - 4));
        (r->phase).quad = uVar24;
        uVar13 = r->write_filled - (int)((ulong)((long)pfVar15 - (long)pfVar14) >> 2);
        goto LAB_0064cef9;
      }
      break;
    case 5:
      uVar28 = (long)r + lVar32 * -4 + (long)r->write_pos * 4 + 0x148;
      pfVar31 = pfVar30 + uVar25;
      if (iVar21 == 0) {
        if (0x20 < (int)uVar13) {
          uVar25 = (r->phase_inc).quad;
          uVar24 = (r->phase).quad;
          iVar29 = (int)(4.3936485e+12 / (float)uVar25);
          if (uVar25 < 0x100000001) {
            iVar29 = 0x3fe;
          }
          uVar22 = uVar28;
          do {
            iVar19 = (int)(uVar24 >> 0x16);
            if (pfVar31 <= pfVar30) break;
            uVar20 = iVar19 - 0x4000;
            uVar23 = (iVar29 * iVar19) / 0x400 + iVar29 * -0x10;
            dVar36 = 0.0;
            for (uVar26 = 0x1f; -0x10 < (int)uVar26 + -0xf; uVar26 = (ulong)((int)uVar26 - 1)) {
              uVar18 = -uVar23;
              if (0 < (int)uVar23) {
                uVar18 = uVar23;
              }
              uVar6 = -uVar20;
              if (0 < (int)uVar20) {
                uVar6 = uVar20;
              }
              fVar34 = window_lut[uVar6];
              fVar37 = sinc_lut[uVar18];
              (&uStack_138)[uVar26] = (double)(fVar34 * fVar37);
              dVar36 = dVar36 + (double)(fVar34 * fVar37);
              uVar20 = uVar20 + 0x400;
              uVar23 = uVar23 + iVar29;
            }
            fVar34 = 0.0;
            for (lVar32 = 0; lVar32 != 0x20; lVar32 = lVar32 + 1) {
              fVar34 = fVar34 + (float)((double)*(float *)(uVar22 + lVar32 * 4) *
                                       (double)(&uStack_138)[lVar32]);
            }
            *pfVar30 = (float)((double)fVar34 / dVar36);
            pfVar30 = pfVar30 + 1;
            uVar22 = uVar22 + (uVar24 + uVar25 >> 0x20) * 4;
            uVar24 = uVar24 + uVar25 & 0xffffffff;
          } while (uVar22 < uVar28 + (uVar17 - 0x20) * 4);
          (r->phase).quad = uVar24;
          iVar29 = (int)(uVar22 - uVar28 >> 2);
          goto LAB_0064ceed;
        }
      }
      else if (0x20 < (int)uVar13) {
        uVar25 = (r->phase_inc).quad;
        uVar22 = (r->phase).quad;
        iVar29 = (int)(4.3936485e+12 / (float)uVar25);
        if (uVar25 < 0x100000001) {
          iVar29 = 0x3fe;
        }
        uVar26 = uVar28;
        do {
          if (pfVar31 <= pfVar30) break;
          iVar19 = (int)(uVar22 >> 0x16);
          uVar13 = (iVar29 * iVar19) / 0x400 + iVar29 * -0x10;
          uVar23 = iVar19 - 0x4000;
          fVar34 = 0.0;
          for (lVar32 = 0x10; -0x10 < lVar32; lVar32 = lVar32 + -1) {
            uVar20 = -uVar13;
            if (0 < (int)uVar13) {
              uVar20 = uVar13;
            }
            uVar18 = -uVar23;
            if (0 < (int)uVar23) {
              uVar18 = uVar23;
            }
            fVar37 = window_lut[uVar18];
            fVar39 = sinc_lut[uVar20];
            local_130[lVar32 + 0xd] = fVar37 * fVar39;
            fVar34 = fVar34 + fVar37 * fVar39;
            uVar13 = uVar13 + iVar29;
            uVar23 = uVar23 + 0x400;
          }
          fVar37 = 0.0;
          fVar39 = 0.0;
          fVar40 = 0.0;
          fVar41 = 0.0;
          for (lVar32 = 0; lVar32 != 0x80; lVar32 = lVar32 + 0x10) {
            pfVar14 = (float *)(uVar26 + lVar32);
            fVar37 = fVar37 + *pfVar14 * *(float *)((long)&uStack_138 + lVar32);
            fVar39 = fVar39 + pfVar14[1] * *(float *)((long)&uStack_138 + lVar32 + 4);
            fVar40 = fVar40 + pfVar14[2] * *(float *)((long)local_130 + lVar32);
            fVar41 = fVar41 + pfVar14[3] * *(float *)((long)local_130 + lVar32 + 4);
          }
          *pfVar30 = (fVar41 + fVar39 + fVar40 + fVar37) * (1.0 / fVar34);
          pfVar30 = pfVar30 + 1;
          uVar26 = uVar26 + (uVar22 + uVar25 >> 0x20) * 4;
          uVar22 = uVar22 + uVar25 & 0xffffffff;
        } while (uVar26 < uVar28 + (uVar17 - 0x20) * 4);
        (r->phase).quad = uVar22;
        iVar29 = (int)(uVar26 - uVar28 >> 2);
        uVar13 = r->write_filled;
LAB_0064ceed:
        uVar13 = uVar13 - iVar29;
        goto LAB_0064cef9;
      }
    }
LAB_0064cefd:
    r->read_filled = (r->read_filled - iVar16) + (int)((ulong)((long)pfVar30 - (long)__src) >> 2);
  } while( true );
}

Assistant:

static void resampler_fill_and_remove_delay(resampler * r)
{
    resampler_fill( r );
    if ( r->delay_removed < 0 )
    {
        int delay = resampler_output_delay( r );
        r->delay_removed = 0;
        while ( delay-- )
            resampler_remove_sample( r, 1 );
    }
}